

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMan.c
# Opt level: O1

int Aig_ManCiCleanup(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  Vec_Ptr_t *pVVar8;
  void **ppvVar9;
  void *pvVar10;
  
  iVar1 = p->nObjs[2];
  pVVar8 = p->vCis;
  uVar6 = pVVar8->nSize;
  uVar7 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar4 = 0;
  }
  else {
    iVar2 = p->nRegs;
    lVar5 = 0;
    uVar4 = 0;
    do {
      ppvVar9 = pVVar8->pArray;
      pvVar10 = ppvVar9[lVar5];
      if ((lVar5 < (long)iVar1 - (long)iVar2) &&
         ((*(uint *)((long)pvVar10 + 0x18) & 0xffffffc0) == 0)) {
        uVar6 = *(uint *)((long)pvVar10 + 0x24);
        if (((int)uVar6 < 0) || (p->vObjs->nSize <= (int)uVar6)) {
LAB_006bd5a3:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        ppvVar9 = p->vObjs->pArray;
        pvVar10 = (void *)0x0;
        uVar3 = uVar4;
      }
      else {
        if (((int)uVar4 < 0) || ((int)uVar7 <= (int)uVar4)) goto LAB_006bd5a3;
        uVar3 = uVar4 + 1;
        uVar6 = uVar4;
      }
      uVar4 = uVar3;
      ppvVar9[uVar6] = pvVar10;
      lVar5 = lVar5 + 1;
      pVVar8 = p->vCis;
      uVar6 = pVVar8->nSize;
      uVar7 = (ulong)(int)uVar6;
    } while (lVar5 < (long)uVar7);
  }
  if ((int)uVar6 < (int)uVar4) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
  }
  pVVar8->nSize = uVar4;
  p->nObjs[2] = uVar4;
  if (p->nRegs != 0) {
    p->nTruePis = uVar4 - p->nRegs;
  }
  return iVar1 - uVar4;
}

Assistant:

int Aig_ManCiCleanup( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, k = 0, nPisOld = Aig_ManCiNum(p);
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vCis, pObj, i )
    {
        if ( i >= Aig_ManCiNum(p) - Aig_ManRegNum(p) )
            Vec_PtrWriteEntry( p->vCis, k++, pObj );
        else if ( Aig_ObjRefs(pObj) > 0 )
            Vec_PtrWriteEntry( p->vCis, k++, pObj );
        else
            Vec_PtrWriteEntry( p->vObjs, pObj->Id, NULL );
    }
    Vec_PtrShrink( p->vCis, k );
    p->nObjs[AIG_OBJ_CI] = Vec_PtrSize( p->vCis );
    if ( Aig_ManRegNum(p) )
        p->nTruePis = Aig_ManCiNum(p) - Aig_ManRegNum(p);
    return nPisOld - Aig_ManCiNum(p);
}